

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O1

int_type __thiscall sai::ifstreambuf::underflow(ifstreambuf *this)

{
  long lVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  if (((&this->field_0x60)[*(long *)(*(long *)&this->FileIn + -0x18)] & 2) == 0) {
    if ((*(long *)&this->field_0x10 == *(long *)&this->field_0x18) &&
       (lVar1 = (**(code **)(*(long *)this + 0x28))(this,(ulong)(this->CurrentPage + 1) << 0xc,0,8),
       lVar1 == -1)) {
      return -1;
    }
    uVar2 = (uint)**(byte **)&this->field_0x10;
  }
  return uVar2;
}

Assistant:

std::streambuf::int_type ifstreambuf::underflow()
{
	if( FileIn.eof() )
	{
		return traits_type::eof();
	}

	if( gptr() == egptr() )
	{
		// buffer depleated, get next block
		if( seekpos((CurrentPage + 1) * VirtualPage::PageSize)
			== std::streampos(std::streamoff(-1)) )
		{
			// Seek position error
			return traits_type::eof();
		}
	}

	return traits_type::to_int_type(*gptr());
}